

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O2

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CCallExpression *expression)

{
  CExpression *pCVar1;
  pointer puVar2;
  CExpressionList *pCVar3;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar4;
  CSeqStatement *this_00;
  CEseqExpression *this_01;
  CCallExpression *pCVar5;
  INode IVar6;
  CEseqFloatVisitor *pCVar7;
  CEseqFloatVisitor *this_02;
  CSeqStatement *pCVar8;
  int i;
  ulong uVar9;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_b0;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_a8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_a0;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  helpStatements;
  unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_> local_78;
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  _Head_base<0UL,_const_IRT::CExpressionList_*,_false> local_48;
  CEseqFloatVisitor *local_40;
  CCallExpression *local_38;
  
  pCVar3 = CCallExpression::getArguments(expression);
  (**(pCVar3->super_IExpression).super_INode._vptr_INode)(pCVar3);
  this_02 = (CEseqFloatVisitor *)
            (this->childExpressionList)._M_t.
            super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
            .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl;
  (this->childExpressionList)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
  .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl = (CExpressionList *)0x0;
  pvVar4 = CExpressionList::getExpressions((CExpressionList *)this_02);
  if ((pvVar4->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (pvVar4->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pCVar5 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction(expression);
    CNameExpression::CopyCast((CNameExpression *)&helpStatements);
    local_58._8_8_ =
         helpStatements.
         super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58._0_8_ = this_02;
    CCallExpression::CCallExpression
              (pCVar5,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)(local_58 + 8),
               (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                *)local_58);
    pCVar1 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)pCVar5;
    if (pCVar1 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
    }
    if ((CEseqFloatVisitor *)local_58._0_8_ != (CEseqFloatVisitor *)0x0) {
      (**(code **)(*(long *)local_58._0_8_ + 0x10))();
    }
    local_58._0_8_ = 0;
    if ((pointer)local_58._8_8_ != (pointer)0x0) {
      (**(code **)((long)*(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
                           *)local_58._8_8_ + 0x10))();
    }
    local_58._8_8_ = 0;
    if (helpStatements.
        super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) {
      return;
    }
    IVar6._vptr_INode =
         (_func_int **)
         ((helpStatements.
           super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start)->_M_t).
         super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>.
         _M_t.
         super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
         .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    this_02 = (CEseqFloatVisitor *)
              helpStatements.
              super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  else {
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_head_impl = (CExpressionList *)operator_new(0x20);
    local_38 = expression;
    CExpressionList::CExpressionList(local_48._M_head_impl,(CExpression *)0x0);
    for (uVar9 = 0; pvVar4 = CExpressionList::getExpressions((CExpressionList *)this_02),
        uVar9 < (ulong)((long)(pvVar4->
                              super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar4->
                              super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
      pCVar7 = this_02;
      pvVar4 = CExpressionList::getExpressions((CExpressionList *)this_02);
      processCallArgument(pCVar7,(CExpression *)
                                 (pvVar4->
                                 super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
                                 super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                                 ._M_t,local_48._M_head_impl,&helpStatements);
    }
    pCVar8 = (CSeqStatement *)
             helpStatements.
             super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
    helpStatements.
    super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         helpStatements.
         super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_40 = this;
    std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
              (helpStatements.
               super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    for (uVar9 = 0;
        puVar2 = helpStatements.
                 super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
        uVar9 < (ulong)((long)helpStatements.
                              super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)helpStatements.
                              super__Vector_base<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
      this_00 = (CSeqStatement *)operator_new(0x18);
      local_a0._M_head_impl =
           puVar2[uVar9]._M_t.
           super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
           .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
      puVar2[uVar9]._M_t.
      super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t
      .super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
      super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
      local_a8._M_head_impl = &pCVar8->super_CStatement;
      CSeqStatement::CSeqStatement
                (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                          *)&local_a0,
                 (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)
                 &local_a8);
      if ((CSeqStatement *)local_a8._M_head_impl != (CSeqStatement *)0x0) {
        (*((INode *)&((local_a8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
          _vptr_INode[2])();
      }
      local_a8._M_head_impl = (CStatement *)0x0;
      if (local_a0._M_head_impl != (CStatement *)0x0) {
        (*((local_a0._M_head_impl)->super_IStatement).super_INode._vptr_INode[2])();
      }
      local_a0._M_head_impl = (CStatement *)0x0;
      pCVar8 = this_00;
    }
    this_01 = (CEseqExpression *)operator_new(0x18);
    local_b0._M_head_impl = &pCVar8->super_CStatement;
    pCVar5 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction(local_38);
    CNameExpression::CopyCast((CNameExpression *)local_70);
    local_70._8_8_ = local_70._0_8_;
    local_70._0_8_ = (_func_int **)0x0;
    local_78._M_t.
    super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
    .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
            )local_48._M_head_impl;
    CCallExpression::CCallExpression
              (pCVar5,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)(local_70 + 8),&local_78);
    pCVar7 = local_40;
    local_70._16_8_ = pCVar5;
    CEseqExpression::CEseqExpression
              (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_b0,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               (local_70 + 0x10));
    pCVar1 = (pCVar7->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (pCVar7->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_01;
    if (pCVar1 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar1->super_IExpression).super_INode + 0x10))();
    }
    if ((CCallExpression *)local_70._16_8_ != (CCallExpression *)0x0) {
      (*(((CExpression *)local_70._16_8_)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_70._16_8_ = 0;
    if (local_78._M_t.
        super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
        ._M_t.
        super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
        .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
         )0x0) {
      (**(code **)(*(long *)local_78._M_t.
                            super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
                            .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl
                  + 0x10))();
    }
    local_78._M_t.
    super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
    .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl =
         (__uniq_ptr_data<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>,_true,_true>
          )(__uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
            )0x0;
    if ((_func_int **)local_70._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._8_8_ + 0x10))();
    }
    local_70._8_8_ = (pointer)0x0;
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 0x10))();
    }
    if ((CSeqStatement *)local_b0._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_b0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_b0._M_head_impl = (CStatement *)0x0;
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::~vector(&helpStatements);
    IVar6._vptr_INode = (this_02->super_IVisitor)._vptr_IVisitor;
  }
  (*IVar6._vptr_INode[2])(this_02);
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CCallExpression &expression) {
    expression.getArguments()->Accept(*this);
    std::unique_ptr<const CExpressionList> args = std::move(childExpressionList);

    if (args->getExpressions().size() == 0) {
        childExpression = EMOVE_UNIQ(new CCallExpression(
                std::move(expression.getFunction()->CopyCast()),
                std::move(args)
        ));

        return;
    }

    std::vector<std::unique_ptr<const CStatement>> helpStatements;

    CExpressionList* tempExpressionList = new CExpressionList();

    for (int i = 0; i < args->getExpressions().size(); ++i) {
        processCallArgument(args->getExpressions()[i].get(), tempExpressionList, helpStatements);
    }

    std::unique_ptr<const CStatement> rightStatement = std::move(helpStatements.back());
    helpStatements.pop_back();
    for (int i = 0; i < helpStatements.size(); ++i) {
        rightStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(helpStatements[i]),
                std::move(rightStatement)
        ));
    }

    childExpression = EMOVE_UNIQ(new CEseqExpression(
            std::move(rightStatement),
            EMOVE_UNIQ(new CCallExpression(
                    std::move(expression.getFunction()->CopyCast()),
                    std::move(std::unique_ptr<const CExpressionList>(tempExpressionList))
            ))
    ));
}